

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalOperator::Copy(LogicalOperator *this,ClientContext *context)

{
  Allocator *allocator_p;
  ClientContext *in_RDX;
  MemoryStream stream;
  undefined1 local_650 [56];
  SerializationOptions options;
  bound_parameter_map_t parameters;
  BinarySerializer serializer;
  
  allocator_p = Allocator::Get(in_RDX);
  MemoryStream::MemoryStream(&stream,allocator_p,0x200);
  SerializationOptions::SerializationOptions(&options);
  SerializationCompatibility::Latest();
  SerializationCompatibility::operator=
            (&options.serialization_compatibility,(SerializationCompatibility *)&serializer);
  ::std::__cxx11::string::~string((string *)&serializer);
  SerializationOptions::SerializationOptions((SerializationOptions *)local_650,&options);
  BinarySerializer::BinarySerializer
            (&serializer,&stream.super_WriteStream,(SerializationOptions *)local_650);
  ::std::__cxx11::string::~string((string *)(local_650 + 8));
  BinarySerializer::OnObjectBegin(&serializer);
  (**(code **)((long)&(((context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_
                        .internal.
                        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->config).home_directory + 8))(context,&serializer);
  BinarySerializer::OnObjectEnd(&serializer);
  MemoryStream::Rewind(&stream);
  parameters._M_h._M_buckets = &parameters._M_h._M_single_bucket;
  parameters._M_h._M_bucket_count = 1;
  parameters._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  parameters._M_h._M_element_count = 0;
  parameters._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  parameters._M_h._M_rehash_policy._M_next_resize = 0;
  parameters._M_h._M_single_bucket = (__node_base_ptr)0x0;
  BinaryDeserializer::Deserialize<duckdb::LogicalOperator>
            ((BinaryDeserializer *)this,&stream.super_ReadStream,in_RDX,&parameters);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&parameters._M_h);
  BinarySerializer::~BinarySerializer(&serializer);
  ::std::__cxx11::string::~string((string *)&options.serialization_compatibility);
  MemoryStream::~MemoryStream(&stream);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalOperator::Copy(ClientContext &context) const {
	MemoryStream stream(Allocator::Get(context));
	SerializationOptions options;
	options.serialization_compatibility = SerializationCompatibility::Latest();
	BinarySerializer serializer(stream, options);
	try {
		serializer.Begin();
		this->Serialize(serializer);
		serializer.End();
	} catch (NotImplementedException &ex) {
		ErrorData error(ex);
		throw NotImplementedException("Logical Operator Copy requires the logical operator and all of its children to "
		                              "be serializable: " +
		                              error.RawMessage());
	}
	stream.Rewind();
	bound_parameter_map_t parameters;
	auto op_copy = BinaryDeserializer::Deserialize<LogicalOperator>(stream, context, parameters);
	return op_copy;
}